

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

void rlCheckErrors(void)

{
  GLenum GVar1;
  char *text;
  
LAB_00117e29:
  do {
    GVar1 = (*glad_glGetError)();
    switch(GVar1) {
    case 0x500:
      text = "GL: Error detected: GL_INVALID_ENUM";
      break;
    case 0x501:
      text = "GL: Error detected: GL_INVALID_VALUE";
      break;
    case 0x502:
      text = "GL: Error detected: GL_INVALID_OPERATION";
      break;
    case 0x503:
      text = "GL: Error detected: GL_STACK_OVERFLOW";
      break;
    case 0x504:
      text = "GL: Error detected: GL_STACK_UNDERFLOW";
      break;
    case 0x505:
      text = "GL: Error detected: GL_OUT_OF_MEMORY";
      break;
    case 0x506:
      text = "GL: Error detected: GL_INVALID_FRAMEBUFFER_OPERATION";
      break;
    default:
      goto switchD_00117e43_default;
    }
    TraceLog(4,text);
  } while( true );
switchD_00117e43_default:
  if (GVar1 == 0) {
    return;
  }
  TraceLog(4,"GL: Error detected: Unknown error code: %x",(ulong)GVar1);
  goto LAB_00117e29;
}

Assistant:

void rlCheckErrors()
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    int check = 1;
    while (check)
    {
        const GLenum err = glGetError();
        switch (err)
        {
            case GL_NO_ERROR: check = 0; break;
            case 0x0500: TRACELOG(LOG_WARNING, "GL: Error detected: GL_INVALID_ENUM"); break;
            case 0x0501: TRACELOG(LOG_WARNING, "GL: Error detected: GL_INVALID_VALUE"); break;
            case 0x0502: TRACELOG(LOG_WARNING, "GL: Error detected: GL_INVALID_OPERATION"); break;
            case 0x0503: TRACELOG(LOG_WARNING, "GL: Error detected: GL_STACK_OVERFLOW"); break;
            case 0x0504: TRACELOG(LOG_WARNING, "GL: Error detected: GL_STACK_UNDERFLOW"); break;
            case 0x0505: TRACELOG(LOG_WARNING, "GL: Error detected: GL_OUT_OF_MEMORY"); break;
            case 0x0506: TRACELOG(LOG_WARNING, "GL: Error detected: GL_INVALID_FRAMEBUFFER_OPERATION"); break;
            default: TRACELOG(LOG_WARNING, "GL: Error detected: Unknown error code: %x", err); break;
        }
    }
#endif
}